

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
* __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedWrite::tryReadImpl
          (OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
           *__return_storage_ptr__,BlockedWrite *this,void *readBufferPtr,size_t minBytes,
          size_t maxBytes)

{
  size_t *psVar1;
  uchar *__src;
  ulong __n;
  size_t sVar2;
  ArrayPtr<const_unsigned_char> *pAVar3;
  size_t sVar4;
  size_t n_1;
  size_t n;
  ulong uVar5;
  long lVar6;
  DebugExpression<bool> _kjCondition;
  undefined1 local_51;
  OneOf<kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Done,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite::Retry>
  *local_50;
  size_t local_48;
  ArrayPtr<const_unsigned_char> *local_40;
  Fault f;
  
  _kjCondition.value = (this->canceler).list.ptr == (AdapterBase *)0x0;
  local_50 = __return_storage_ptr__;
  if (!_kjCondition.value) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
               ,0x2c9,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",&_kjCondition,
               (char (*) [16])"already pumping");
    kj::_::Debug::Fault::fatal(&f);
  }
  local_40 = &this->writeBuffer;
  uVar5 = 0;
  local_48 = minBytes;
  do {
    __src = (this->writeBuffer).ptr;
    __n = (this->writeBuffer).size_;
    if (maxBytes < __n) {
      memcpy(readBufferPtr,__src,maxBytes);
      (this->writeBuffer).ptr = (this->writeBuffer).ptr + maxBytes;
      psVar1 = &(this->writeBuffer).size_;
      *psVar1 = *psVar1 - maxBytes;
      uVar5 = uVar5 + maxBytes;
LAB_003cef68:
      local_50->tag = 1;
      lVar6 = 8;
LAB_003cef70:
      *(ulong *)((long)&local_50->tag + lVar6) = uVar5;
      return local_50;
    }
    memcpy(readBufferPtr,__src,__n);
    uVar5 = uVar5 + __n;
    readBufferPtr = (void *)((long)readBufferPtr + __n);
    sVar2 = (this->morePieces).size_;
    if (sVar2 == 0) {
      (*(this->fulfiller->super_PromiseRejector)._vptr_PromiseRejector[2])
                (this->fulfiller,&local_51);
      if ((BlockedWrite *)(this->pipe->state).ptr == this) {
        (this->pipe->state).ptr = (AsyncCapabilityStream *)0x0;
      }
      if (local_48 < uVar5 || local_48 - uVar5 == 0) goto LAB_003cef68;
      local_50->tag = 2;
      *(void **)&local_50->field_1 = readBufferPtr;
      *(size_t *)((long)&local_50->field_1 + 8) = local_48 - uVar5;
      *(size_t *)((long)&local_50->field_1 + 0x10) = maxBytes - __n;
      lVar6 = 0x20;
      goto LAB_003cef70;
    }
    pAVar3 = (this->morePieces).ptr;
    sVar4 = pAVar3->size_;
    local_40->ptr = pAVar3->ptr;
    local_40->size_ = sVar4;
    (this->morePieces).ptr = pAVar3 + 1;
    (this->morePieces).size_ = sVar2 - 1;
    maxBytes = maxBytes - __n;
  } while( true );
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}